

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

bool __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
::next_byte_in_range
          (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
           *this,initializer_list<int> ranges)

{
  int *piVar1;
  int *piVar2;
  bool bVar3;
  ulong uVar4;
  int *piVar5;
  char cVar6;
  const_iterator range;
  bool bVar7;
  
  uVar4 = ranges._M_len;
  piVar5 = ranges._M_array;
  if ((6 < uVar4) || ((0x54UL >> (uVar4 & 0x3f) & 1) == 0)) {
    __assert_fail("ranges.size() == 2 || ranges.size() == 4 || ranges.size() == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/nlohmann/json.hpp"
                  ,0x1913,
                  "bool nlohmann::detail::lexer<nlohmann::basic_json<>, nlohmann::detail::input_stream_adapter>::next_byte_in_range(std::initializer_list<char_int_type>) [BasicJsonType = nlohmann::basic_json<>, InputAdapterType = nlohmann::detail::input_stream_adapter]"
                 );
  }
  cVar6 = (char)this + 'P';
  std::__cxx11::string::push_back(cVar6);
  bVar7 = uVar4 == 0;
  if (!bVar7) {
    piVar2 = piVar5 + uVar4;
    do {
      get(this);
      if (this->current < *piVar5) {
        bVar3 = false;
      }
      else {
        piVar1 = piVar5 + 1;
        piVar5 = piVar5 + 1;
        bVar3 = this->current <= *piVar1;
      }
      if (!bVar3) {
        this->error_message = "invalid string: ill-formed UTF-8 byte";
        return bVar7;
      }
      std::__cxx11::string::push_back(cVar6);
      piVar5 = piVar5 + 1;
      bVar7 = piVar5 == piVar2;
    } while (!bVar7);
  }
  return bVar7;
}

Assistant:

bool next_byte_in_range(std::initializer_list<char_int_type> ranges)
    {
        JSON_ASSERT(ranges.size() == 2 || ranges.size() == 4 || ranges.size() == 6);
        add(current);

        for (auto range = ranges.begin(); range != ranges.end(); ++range)
        {
            get();
            if (JSON_HEDLEY_LIKELY(*range <= current && current <= *(++range)))
            {
                add(current);
            }
            else
            {
                error_message = "invalid string: ill-formed UTF-8 byte";
                return false;
            }
        }

        return true;
    }